

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTNode.cpp
# Opt level: O2

void __thiscall
phaeton::ASTNodeList<const_phaeton::Decl,_(phaeton::ASTNode::ASTNodeKind)1,_phaeton::DeclList>::
_delete(ASTNodeList<const_phaeton::Decl,_(phaeton::ASTNode::ASTNodeKind)1,_phaeton::DeclList> *this)

{
  pointer ppDVar1;
  Decl *pDVar2;
  int i;
  long lVar3;
  
  for (lVar3 = 0;
      ppDVar1 = (this->Elements).
                super__Vector_base<const_phaeton::Decl_*,_std::allocator<const_phaeton::Decl_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      lVar3 < (int)((ulong)((long)(this->Elements).
                                  super__Vector_base<const_phaeton::Decl_*,_std::allocator<const_phaeton::Decl_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar1) >> 3);
      lVar3 = lVar3 + 1) {
    Decl::_delete(ppDVar1[lVar3]);
    pDVar2 = (this->Elements).
             super__Vector_base<const_phaeton::Decl_*,_std::allocator<const_phaeton::Decl_*>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar3];
    if (pDVar2 != (Decl *)0x0) {
      (*(pDVar2->super_ASTNode)._vptr_ASTNode[4])();
    }
  }
  return;
}

Assistant:

void ASTNodeList<T, NK, Derived>::_delete() const {
  for (int i = 0; i < size(); i++) {
    Elements[i]->_delete();
    delete Elements[i];
  }
}